

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::AdjacencyInfo::AddNeighbor(AdjacencyInfo *this,long element,long neighbor)

{
  long lVar1;
  long local_40;
  long p;
  long p1;
  long p0;
  long neighbor_local;
  long element_local;
  AdjacencyInfo *this_local;
  
  if (this->m_numNeighbors[this->m_numElements + -1] < this->m_numNeighbors[element]) {
    __assert_fail("m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                  ,0x6c,"O3DGCErrorCode o3dgc::AdjacencyInfo::AddNeighbor(long, long)");
  }
  local_40 = Begin(this,element);
  lVar1 = End(this,element);
  while( true ) {
    if (lVar1 <= local_40) {
      return O3DGC_ERROR_BUFFER_FULL;
    }
    if (this->m_neighbors[local_40] == -1) break;
    local_40 = local_40 + 1;
  }
  this->m_neighbors[local_40] = neighbor;
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode          AddNeighbor(long element, long neighbor)
                                {
                                    assert(m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]);
                                    long p0 = Begin(element);
                                    long p1 = End(element);
                                    for(long p = p0; p < p1; p++)
                                    {
                                        if (m_neighbors[p] == -1)
                                        {
                                            m_neighbors[p] = neighbor;
                                            return O3DGC_OK;
                                        }
                                    }
                                    return O3DGC_ERROR_BUFFER_FULL;
                                }